

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

int __thiscall QTabBarPrivate::selectNewCurrentIndexFrom(QTabBarPrivate *this,int fromIndex)

{
  qsizetype qVar1;
  Tab *pTVar2;
  int in_ESI;
  QTabBarPrivate *in_RDI;
  int i_1;
  int i;
  int newindex;
  int index;
  int local_18;
  int local_14;
  int local_10;
  
  local_10 = -1;
  local_14 = in_ESI;
  do {
    qVar1 = QList<QTabBarPrivate::Tab_*>::size(&in_RDI->tabList);
    index = local_14 >> 0x1f;
    if (qVar1 <= local_14) {
LAB_006adf58:
      if (local_10 < 0) {
        for (local_18 = in_ESI + -1; -1 < local_18; local_18 = local_18 + -1) {
          pTVar2 = at(in_RDI,index);
          if ((((byte)pTVar2->field_0xe4 >> 1 & 1) != 0) &&
             (pTVar2 = at(in_RDI,index), (pTVar2->field_0xe4 & 1) != 0)) {
            return local_18;
          }
        }
      }
      return local_10;
    }
    pTVar2 = at(in_RDI,index);
    if ((((byte)pTVar2->field_0xe4 >> 1 & 1) != 0) &&
       (pTVar2 = at(in_RDI,index), (pTVar2->field_0xe4 & 1) != 0)) {
      local_10 = local_14;
      goto LAB_006adf58;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

int QTabBarPrivate::selectNewCurrentIndexFrom(int fromIndex)
{
    int newindex = -1;
    for (int i = fromIndex; i < tabList.size(); ++i) {
        if (at(i)->visible && at(i)->enabled) {
          newindex = i;
          break;
        }
    }
    if (newindex < 0) {
        for (int i = fromIndex-1; i > -1; --i) {
            if (at(i)->visible && at(i)->enabled) {
              newindex = i;
              break;
            }
        }
    }

    return newindex;
}